

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# computation.c
# Opt level: O1

apx_error_t
apx_rationalScaling_create
          (apx_rationalScaling_t *self,double offset,int32_t numerator,int32_t denominator,
          char *unit)

{
  char *pcVar1;
  apx_error_t aVar2;
  
  if (self == (apx_rationalScaling_t *)0x0) {
    aVar2 = 1;
  }
  else {
    (self->base).vtable.destructor = apx_rationalScaling_vdestroy;
    (self->base).vtable.to_string = apx_rationalScaling_vto_string;
    (self->base).computation_type = '\x01';
    (self->base).is_signed_range = false;
    (self->base).lower_limit = (anon_union_4_2_43a9a9ed_for_lower_limit)0x0;
    (self->base).upper_limit = (anon_union_4_2_43a9a9ed_for_upper_limit)0x0;
    self->offset = offset;
    self->numerator = numerator;
    self->denominator = denominator;
    aVar2 = 0;
    if (unit == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar1 = strdup(unit);
    }
    self->unit = pcVar1;
  }
  return aVar2;
}

Assistant:

apx_error_t apx_rationalScaling_create(apx_rationalScaling_t* self, double offset, int32_t numerator, int32_t denominator, char const* unit)
{
   if (self != NULL)
   {
      apx_computation_vtable_t vtable;
      apx_computation_vtable_create(&vtable, apx_rationalScaling_vdestroy, apx_rationalScaling_vto_string);
      apx_computation_create(&self->base, &vtable, APX_COMPUTATION_TYPE_RATIONAL_SCALING);
      self->offset = offset;
      self->numerator = numerator;
      self->denominator = denominator;
      if (unit != NULL)
      {
         self->unit = STRDUP(unit);
         if (unit == NULL)
         {
            return APX_MEM_ERROR;
         }
      }
      else
      {
         self->unit = NULL;
      }
      return APX_NO_ERROR;
   }
   return APX_INVALID_ARGUMENT_ERROR;
}